

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O1

S2Cap * __thiscall S2LatLngRect::GetCapBound(S2Cap *__return_storage_ptr__,S2LatLngRect *this)

{
  VType *pVVar1;
  bool bVar2;
  int k;
  uint uVar3;
  double dVar4;
  S1Angle angle;
  double dVar5;
  double dVar6;
  double local_90;
  ostream *local_88;
  S2Point local_80;
  undefined **local_68;
  S2Point local_60;
  S1ChordAngle SStack_48;
  S2LatLng local_40;
  
  dVar5 = (this->lat_).bounds_.c_[0];
  pVVar1 = (this->lat_).bounds_.c_ + 1;
  if (dVar5 < *pVVar1 || dVar5 == *pVVar1) {
    dVar4 = (this->lat_).bounds_.c_[1];
    dVar6 = dVar5 + dVar4;
    if (0.0 <= dVar6) {
      dVar4 = -dVar5;
    }
    local_60.c_[2] = *(VType *)(&DAT_0027dda0 + (ulong)(dVar6 < 0.0) * 8);
    local_68 = &PTR__S2Region_002c1748;
    local_60.c_[0] = 0.0;
    local_60.c_[1] = 0.0;
    angle.radians_ = 3.141592653589793;
    if (dVar4 + 1.5707963267948966 <= 3.141592653589793) {
      angle.radians_ = dVar4 + 1.5707963267948966;
    }
    S1ChordAngle::S1ChordAngle(&SStack_48,angle);
    bVar2 = S2::IsUnitLength(&local_60);
    if ((!bVar2) || (4.0 < SStack_48.length2_)) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
                 ,0xf0,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_80.c_[1],"Check failed: is_valid() ",0x19);
LAB_001f8d99:
      abort();
    }
    dVar5 = (this->lng_).bounds_.c_[1] - (this->lng_).bounds_.c_[0];
    dVar4 = remainder(dVar5,6.283185307179586);
    if ((0.0 <= dVar4) && (dVar5 < 6.283185307179586)) {
      dVar5 = (this->lat_).bounds_.c_[0];
      dVar4 = (this->lat_).bounds_.c_[1];
      local_40.coords_.c_[1] = S1Interval::GetCenter(&this->lng_);
      local_40.coords_.c_[0] = (dVar5 + dVar4) * 0.5;
      S2LatLng::ToPoint(&local_80,&local_40);
      (__return_storage_ptr__->super_S2Region)._vptr_S2Region =
           (_func_int **)&PTR__S2Region_002c1748;
      (__return_storage_ptr__->center_).c_[0] = local_80.c_[0];
      (__return_storage_ptr__->center_).c_[1] = local_80.c_[1];
      (__return_storage_ptr__->center_).c_[2] = local_80.c_[2];
      S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,(S1Angle)0x0);
      bVar2 = S2::IsUnitLength(&__return_storage_ptr__->center_);
      if ((!bVar2) || (4.0 < (__return_storage_ptr__->radius_).length2_)) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_90,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
                   ,0xf0,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_88,"Check failed: is_valid() ",0x19);
        goto LAB_001f8d99;
      }
      uVar3 = 0;
      do {
        dVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                          ((BasicVector<Vector2,_double,_2UL> *)&this->lat_,uVar3 >> 1);
        local_88 = (ostream *)
                   util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                             ((BasicVector<Vector2,_double,_2UL> *)&this->lng_,
                              uVar3 & 1 ^ uVar3 >> 1);
        local_90 = dVar5;
        S2LatLng::ToPoint(&local_80,(S2LatLng *)&local_90);
        S2Cap::AddPoint(__return_storage_ptr__,&local_80);
        uVar3 = uVar3 + 1;
      } while (uVar3 != 4);
      if ((__return_storage_ptr__->radius_).length2_ * 0.5 < SStack_48.length2_ * 0.5) {
        return __return_storage_ptr__;
      }
    }
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002c1748;
    (__return_storage_ptr__->center_).c_[0] = local_60.c_[0];
    (__return_storage_ptr__->center_).c_[1] = local_60.c_[1];
    (__return_storage_ptr__->center_).c_[2] = local_60.c_[2];
    (__return_storage_ptr__->radius_).length2_ = SStack_48.length2_;
  }
  else {
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002c1748;
    (__return_storage_ptr__->center_).c_[0] = 1.0;
    (__return_storage_ptr__->center_).c_[1] = 0.0;
    (__return_storage_ptr__->center_).c_[2] = 0.0;
    S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,-1.0);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2LatLngRect::GetCapBound() const {
  // We consider two possible bounding caps, one whose axis passes
  // through the center of the lat-long rectangle and one whose axis
  // is the north or south pole.  We return the smaller of the two caps.

  if (is_empty()) return S2Cap::Empty();

  double pole_z, pole_angle;
  if (lat_.lo() + lat_.hi() < 0) {
    // South pole axis yields smaller cap.
    pole_z = -1;
    pole_angle = M_PI_2 + lat_.hi();
  } else {
    pole_z = 1;
    pole_angle = M_PI_2 - lat_.lo();
  }
  S2Cap pole_cap(S2Point(0, 0, pole_z), S1Angle::Radians(pole_angle));

  // For bounding rectangles that span 180 degrees or less in longitude, the
  // maximum cap size is achieved at one of the rectangle vertices.  For
  // rectangles that are larger than 180 degrees, we punt and always return a
  // bounding cap centered at one of the two poles.
  double lng_span = lng_.hi() - lng_.lo();
  if (remainder(lng_span, 2 * M_PI) >= 0 && lng_span < 2 * M_PI) {
    S2Cap mid_cap(GetCenter().ToPoint(), S1Angle::Radians(0));
    for (int k = 0; k < 4; ++k) {
      mid_cap.AddPoint(GetVertex(k).ToPoint());
    }
    if (mid_cap.height() < pole_cap.height())
      return mid_cap;
  }
  return pole_cap;
}